

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::RegisterInstantiation
          (TypeParameterizedTestSuiteRegistry *this,char *test_suite_name)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  GTestLog local_64;
  _Self local_60 [3];
  allocator<char> local_41;
  key_type local_40;
  _Self local_20;
  iterator it;
  char *test_suite_name_local;
  TypeParameterizedTestSuiteRegistry *this_local;
  
  it._M_node = (_Base_ptr)test_suite_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,test_suite_name,&local_41);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
       ::find(&this->suites_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
       ::end(&this->suites_);
  bVar1 = std::operator!=(&local_20,local_60);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>
             ::operator->(&local_20);
    (ppVar2->second).instantiated = true;
  }
  else {
    GTestLog::GTestLog(&local_64,GTEST_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/googletest/googletest/src/gtest.cc"
                       ,0x218);
    poVar3 = GTestLog::GetStream(&local_64);
    poVar3 = std::operator<<(poVar3,"Unknown type parameterized test suit \'");
    poVar3 = std::operator<<(poVar3,(char *)it._M_node);
    std::operator<<(poVar3,"\'");
    GTestLog::~GTestLog(&local_64);
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::RegisterInstantiation(
        const char* test_suite_name) {
  auto it = suites_.find(std::string(test_suite_name));
  if (it != suites_.end()) {
    it->second.instantiated = true;
  } else {
    GTEST_LOG_(ERROR) << "Unknown type parameterized test suit '"
                      << test_suite_name << "'";
  }
}